

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void libtorrent::aux::(anonymous_namespace)::
     map_port<libtorrent::natpmp,libtorrent::portmap_protocol,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
               (natpmp *m,portmap_protocol protocol,basic_endpoint<boost::asio::ip::tcp> *ep,
               port_mapping_t *map_handle,string *device)

{
  port_mapping_t *e1;
  portmap_protocol p;
  natpmp *this;
  bool bVar1;
  unsigned_short uVar2;
  port_mapping_t pVar3;
  basic_endpoint<boost::asio::ip::tcp> local_9c;
  basic_endpoint<boost::asio::ip::tcp> local_7c;
  undefined1 local_60 [8];
  address addr;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_34;
  string *local_30;
  string *device_local;
  port_mapping_t *map_handle_local;
  basic_endpoint<boost::asio::ip::tcp> *ep_local;
  natpmp *pnStack_10;
  portmap_protocol protocol_local;
  natpmp *m_local;
  
  local_30 = device;
  device_local = (string *)map_handle;
  map_handle_local = (port_mapping_t *)ep;
  ep_local._7_1_ = protocol;
  pnStack_10 = m;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef(&local_34,-1);
  bVar1 = strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator!=(map_handle,&local_34);
  if (bVar1) {
    natpmp::delete_mapping(pnStack_10,(port_mapping_t)*(int *)device_local);
  }
  strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
            ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
             ((long)&addr.ipv6_address_.scope_id_ + 4),-1);
  *(undefined4 *)device_local = addr.ipv6_address_.scope_id_._4_4_;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
            ((address *)local_60,(basic_endpoint<boost::asio::ip::tcp> *)map_handle_local);
  bVar1 = boost::asio::ip::address::is_v6((address *)local_60);
  if ((!bVar1) || (bVar1 = is_local((address *)local_60), !bVar1)) {
    e1 = map_handle_local;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&local_7c);
    bVar1 = boost::asio::ip::operator!=((basic_endpoint<boost::asio::ip::tcp> *)e1,&local_7c);
    this = pnStack_10;
    p = ep_local._7_1_;
    if (bVar1) {
      uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                        ((basic_endpoint<boost::asio::ip::tcp> *)map_handle_local);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (&local_9c,(basic_endpoint<boost::asio::ip::tcp> *)map_handle_local);
      pVar3 = natpmp::add_mapping(this,p,(uint)uVar2,&local_9c,local_30);
      *(int *)device_local = pVar3.m_val;
    }
  }
  return;
}

Assistant:

void map_port(MapProtocol& m, ProtoType protocol, EndpointType const& ep
			, port_mapping_t& map_handle, std::string const& device)
		{
			if (map_handle != port_mapping_t{-1}) m.delete_mapping(map_handle);
			map_handle = port_mapping_t{-1};

			address const addr = ep.address();
			// with IPv4 the interface might be behind NAT so we can't skip them
			// based on the scope of the local address
			if (addr.is_v6() && is_local(addr))
				return;

			// only update this mapping if we actually have a socket listening
			if (ep != EndpointType())
				map_handle = m.add_mapping(protocol, ep.port(), ep, device);
		}